

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall
ot::commissioner::Interpreter::PrintNetworkMessage
          (Interpreter *this,string *alias,string *aMessage,Color aColor)

{
  string *aLine;
  allocator local_49;
  string local_48;
  Color local_24;
  string *psStack_20;
  Color aColor_local;
  string *aMessage_local;
  string *alias_local;
  Interpreter *this_local;
  
  local_24 = aColor;
  psStack_20 = aMessage;
  aMessage_local = alias;
  alias_local = (string *)this;
  aLine = (string *)std::__cxx11::string::append((char *)alias);
  Console::Write(aLine,kDefault);
  Console::Write(aMessage,local_24);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"\n",&local_49);
  Console::Write(&local_48,kDefault);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

void Interpreter::PrintNetworkMessage(std::string alias, std::string aMessage, Console::Color aColor)
{
    Console::Write(alias.append(": "));
    Console::Write(aMessage, aColor);
    Console::Write("\n");
}